

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O1

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHash
          (HashingClauseVariantIndex *this,Literal **lits,uint length)

{
  Entry *pEVar1;
  uchar uVar2;
  long lVar3;
  undefined1 auVar4 [12];
  uint *__first;
  uint *__last;
  uchar *puVar5;
  uchar *puVar6;
  bool bVar7;
  uint hash_begin;
  uchar *x;
  ulong uVar8;
  byte *pbVar9;
  Iterator local_48;
  
  if (computeHash(Kernel::Literal_const**,unsigned_int)::litOrder == '\0') {
    computeHash();
  }
  computeHash::litOrder._cursor = computeHash::litOrder._stack;
  auVar4._4_8_ = 0;
  auVar4._0_4_ = length;
  ::Lib::Stack<unsigned_int>::loadFromIterator<Lib::RangeIterator<unsigned_int>>
            (&computeHash::litOrder,(RangeIterator<unsigned_int>)(auVar4 << 0x40));
  __last = computeHash::litOrder._cursor;
  __first = computeHash::litOrder._stack;
  if (computeHash::litOrder._stack != computeHash::litOrder._cursor) {
    uVar8 = (long)computeHash::litOrder._cursor - (long)computeHash::litOrder._stack >> 2;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>>
              (computeHash::litOrder._stack,computeHash::litOrder._cursor,
               (ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>)
               lits);
    std::
    __final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>>
              (__first,__last,
               (_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>)
               lits);
  }
  if (computeHash(Kernel::Literal_const**,unsigned_int)::varCnts == '\0') {
    computeHash();
  }
  ::Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&computeHash::varCnts);
  if (length == 0) {
    hash_begin = 0x811c9dc5;
  }
  else {
    hash_begin = 0x811c9dc5;
    uVar8 = 0;
    do {
      hash_begin = computeHashAndCountVariables
                             (this,lits[computeHash::litOrder._stack[uVar8]],&computeHash::varCnts,
                              hash_begin);
      uVar8 = uVar8 + 1;
    } while (length != uVar8);
  }
  if (computeHash::varCnts._size != 0) {
    if (computeHash(Kernel::Literal_const**,unsigned_int)::varCntHistogram == '\0') {
      computeHash();
    }
    computeHash::varCntHistogram._cursor = computeHash::varCntHistogram._stack;
    local_48._base._next = computeHash::varCnts._entries;
    local_48._base._last = computeHash::varCnts._afterLast;
    local_48._base._timestamp = computeHash::varCnts._timestamp;
    bVar7 = ::Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator
            ::hasNext(&local_48);
    if (bVar7) {
      do {
        pEVar1 = local_48._base._next + 1;
        uVar2 = (local_48._base._next)->_val;
        local_48._base._next = pEVar1;
        if (computeHash::varCntHistogram._cursor == computeHash::varCntHistogram._end) {
          ::Lib::Stack<unsigned_char>::expand(&computeHash::varCntHistogram);
        }
        *computeHash::varCntHistogram._cursor = uVar2;
        computeHash::varCntHistogram._cursor = computeHash::varCntHistogram._cursor + 1;
        bVar7 = ::Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::
                Iterator::hasNext(&local_48);
      } while (bVar7);
    }
    puVar6 = computeHash::varCntHistogram._cursor;
    puVar5 = computeHash::varCntHistogram._stack;
    pbVar9 = computeHash::varCntHistogram._stack;
    if (computeHash::varCntHistogram._stack != computeHash::varCntHistogram._cursor) {
      lVar3 = 0x3f;
      if ((long)computeHash::varCntHistogram._cursor - (long)computeHash::varCntHistogram._stack !=
          0) {
        for (; (ulong)((long)computeHash::varCntHistogram._cursor -
                      (long)computeHash::varCntHistogram._stack) >> lVar3 == 0; lVar3 = lVar3 + -1)
        {
        }
      }
      std::__introsort_loop<unsigned_char*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (computeHash::varCntHistogram._stack,computeHash::varCntHistogram._cursor,
                 ((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_char*,__gnu_cxx::__ops::_Iter_less_iter>(puVar5,puVar6);
      pbVar9 = computeHash::varCntHistogram._stack;
    }
    for (; pbVar9 != computeHash::varCntHistogram._cursor; pbVar9 = pbVar9 + 1) {
      hash_begin = hash_begin ^
                   (*pbVar9 ^ 0x811c9dc5) * 0x1000193 + (hash_begin >> 2) + hash_begin * 0x40 +
                   0x9e3779b9;
    }
  }
  return hash_begin;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHash(Literal* const * lits, unsigned length)
{
  // cout << "length " <<  length << endl;

  TIME_TRACE("hvci compute hash");

  static Stack<unsigned> litOrder;
  litOrder.reset();
  litOrder.loadFromIterator(getRangeIterator(0u,length));

  std::sort(litOrder.begin(), litOrder.end(), VariableIgnoringComparator(lits));

  static VarCounts varCnts;
  varCnts.reset();

  unsigned hash = 2166136261u;
  for(unsigned i=0; i<length; i++) {
    unsigned li = litOrder[i];
    hash = computeHashAndCountVariables(lits[li],varCnts,hash);
  }

  if (varCnts.size() > 0) {
    static Stack<unsigned char> varCntHistogram;
    varCntHistogram.reset();
    VarCounts::Iterator it(varCnts);
    while (it.hasNext()) {
      varCntHistogram.push(it.next());
    }

    std::sort(varCntHistogram.begin(),varCntHistogram.end());
    hash = DefaultHash::hash(varCntHistogram, hash);
  }

  return hash;
}